

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

void __thiscall ON_2dPoint::Transform(ON_2dPoint *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = this->x;
  dVar2 = this->y;
  dVar6 = xform->m_xform[3][0] * dVar1 + xform->m_xform[3][1] * dVar2 + xform->m_xform[3][3];
  dVar5 = (double)(~-(ulong)(dVar6 != 0.0) & (ulong)dVar6 |
                  (ulong)(1.0 / dVar6) & -(ulong)(dVar6 != 0.0));
  dVar6 = xform->m_xform[1][1];
  dVar3 = xform->m_xform[1][0];
  dVar4 = xform->m_xform[1][3];
  this->x = dVar5 * (xform->m_xform[0][3] +
                    dVar1 * xform->m_xform[0][0] + xform->m_xform[0][1] * dVar2);
  this->y = dVar5 * (dVar4 + dVar1 * dVar3 + dVar6 * dVar2);
  return;
}

Assistant:

void ON_2dPoint::Transform( const ON_Xform& xform )
{
  double xx,yy,ww;
  ww = xform.m_xform[3][0]*x + xform.m_xform[3][1]*y + xform.m_xform[3][3];
  if ( ww != 0.0 )
    ww = 1.0/ww;
  xx = ww*(xform.m_xform[0][0]*x + xform.m_xform[0][1]*y + xform.m_xform[0][3]);
  yy = ww*(xform.m_xform[1][0]*x + xform.m_xform[1][1]*y + xform.m_xform[1][3]);
  x = xx;
  y = yy;
}